

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntheticData.cpp
# Opt level: O1

MatrixXd *
GeneratePointsOnSphereSurface
          (MatrixXd *__return_storage_ptr__,int samples,Vector3d *center,double radius,double noise)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  result_type rVar4;
  double dVar5;
  uint uVar6;
  long lVar7;
  undefined8 *puVar8;
  Index size;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  Index index_1;
  long lVar13;
  int iVar14;
  double dVar15;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  temp;
  normal_distribution<double> normal;
  mt19937_64 rng;
  void *local_a68;
  void *pvStack_a60;
  undefined8 local_a58;
  double local_a50;
  double local_a48;
  double local_a40;
  double local_a38;
  double local_a30;
  double local_a28;
  double local_a20;
  normal_distribution<double> local_a18;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9f8;
  
  uVar10 = 0;
  local_a58 = 0;
  local_a68 = (void *)0x0;
  pvStack_a60 = (void *)0x0;
  local_9f8._M_x[0] = 0;
  lVar7 = 1;
  do {
    uVar10 = (uVar10 >> 0x3e ^ uVar10) * 0x5851f42d4c957f2d + lVar7;
    local_9f8._M_x[lVar7] = uVar10;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x138);
  local_9f8._M_p = 0x138;
  iVar14 = 0;
  local_a18._M_param._M_mean = 0.0;
  local_a18._M_saved = 0.0;
  local_a18._M_saved_available = false;
  local_a38 = radius;
  local_a18._M_param._M_stddev = noise;
  if (0 < samples) {
    local_a40 = 2.0 / (double)samples;
    local_a48 = local_a40 * 0.5;
    do {
      dVar5 = (double)iVar14 * local_a40 + -1.0 + local_a48;
      dVar3 = 1.0 - dVar5 * dVar5;
      if (dVar3 < 0.0) {
        local_a50 = sqrt(dVar3);
      }
      else {
        local_a50 = SQRT(dVar3);
      }
      dVar3 = (double)iVar14 * 2.399963229728653;
      dVar15 = cos(dVar3);
      dVar3 = sin(dVar3);
      dVar15 = dVar15 * local_a50 * local_a38 +
               (center->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0];
      dVar5 = dVar5 * local_a38 +
              (center->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1];
      dVar3 = dVar3 * local_a50 * local_a38 +
              (center->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2];
      if ((((long)ABS(dVar15) < 0x7ff0000000000000) && ((long)ABS(dVar5) < 0x7ff0000000000000)) &&
         ((long)ABS(dVar3) < 0x7ff0000000000000)) {
        rVar4 = std::normal_distribution<double>::operator()
                          (&local_a18,&local_9f8,&local_a18._M_param);
        local_a20 = dVar15 + rVar4;
        rVar4 = std::normal_distribution<double>::operator()
                          (&local_a18,&local_9f8,&local_a18._M_param);
        local_a28 = dVar5 + rVar4;
        rVar4 = std::normal_distribution<double>::operator()
                          (&local_a18,&local_9f8,&local_a18._M_param);
        local_a30 = dVar3 + rVar4;
        std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
        ::emplace_back<double,double,double>
                  ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                    *)&local_a68,&local_a20,&local_a28,&local_a30);
      }
      iVar14 = iVar14 + 1;
    } while (samples != iVar14);
  }
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_rows = 0;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
  m_storage.m_cols = 0;
  if ((long)pvStack_a60 - (long)local_a68 < -0x17) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  lVar7 = (long)pvStack_a60 - (long)local_a68 >> 3;
  lVar9 = lVar7 * -0x5555555555555555;
  if ((pvStack_a60 != local_a68) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar9),0) < 3)) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = std::ios::widen;
    __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,lVar7,3,lVar9);
  if (pvStack_a60 != local_a68) {
    uVar10 = 0;
    uVar12 = 0;
    do {
      pdVar2 = (__return_storage_ptr__->
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
      lVar7 = (__return_storage_ptr__->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
      if (lVar7 < 0 && pdVar2 != (double *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                     );
      }
      if ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>)
          .m_storage.m_cols <= (long)uVar10) {
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                     );
      }
      if (lVar7 != 3) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>]"
                     );
      }
      uVar11 = 3;
      if ((((ulong)(pdVar2 + uVar10 * 3) & 7) == 0) &&
         (uVar11 = (ulong)((uint)((ulong)(pdVar2 + uVar10 * 3) >> 3) & 1), 2 < uVar11)) {
        uVar11 = 3;
      }
      lVar7 = uVar12 * 0x18;
      if (uVar11 != 0) {
        uVar10 = 0;
        do {
          pdVar2[uVar12 * 3 + uVar10] = *(double *)((long)local_a68 + uVar10 * 8 + lVar7);
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      lVar13 = 3 - uVar11;
      lVar9 = (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + uVar11;
      if (1 < lVar13) {
        do {
          pdVar1 = (double *)((long)local_a68 + uVar11 * 8 + lVar7);
          dVar3 = pdVar1[1];
          pdVar2[uVar12 * 3 + uVar11] = *pdVar1;
          (pdVar2 + uVar12 * 3 + uVar11)[1] = dVar3;
          uVar11 = uVar11 + 2;
        } while ((long)uVar11 < lVar9);
      }
      if (lVar9 < 3) {
        do {
          pdVar2[uVar12 * 3 + lVar9] = *(double *)((long)local_a68 + lVar9 * 8 + lVar7);
          lVar9 = lVar9 + 1;
        } while (lVar9 != 3);
      }
      uVar6 = (int)uVar12 + 1;
      uVar10 = (ulong)uVar6;
      uVar11 = ((long)pvStack_a60 - (long)local_a68 >> 3) * -0x5555555555555555;
      uVar12 = (ulong)uVar6;
    } while (uVar10 <= uVar11 && uVar11 - uVar10 != 0);
  }
  if (local_a68 != (void *)0x0) {
    operator_delete(local_a68);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd
GeneratePointsOnSphereSurface(
	const int samples,
	const Eigen::Vector3d center,
	const double radius,
	const double noise)
{
	std::vector<Eigen::Vector3d> temp;

	std::mt19937_64 rng(0);
	std::normal_distribution<double> normal(0, noise);

	const auto offset = 2. / samples;
	const auto increment = M_PI * (3. - sqrt(5.));

	for (int i = 0, k = 0; i < samples; i++) {
		const auto y = ((i * offset) - 1) + (offset / 2);
		const auto r = sqrt(1 - y*y);
		const auto phi = i * increment;
		const auto x = cos(phi) * r;
		const auto z = sin(phi) * r;
		const auto xx = x * radius + center[0];
		const auto yy = y * radius + center[1];
		const auto zz = z * radius + center[2];
		if (std::isfinite(xx) && std::isfinite(yy) && std::isfinite(zz)) {
			temp.emplace_back(xx + normal(rng), yy + normal(rng), zz + normal(rng));
		}
	}

	Eigen::MatrixXd out;
	out.resize(3, temp.size());
	for (unsigned int i = 0; i < temp.size(); i++) {
		out.col(i) = temp[i];
	}

	return out;
}